

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  Allocator *pAVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  Deconvolution *pDVar8;
  Option *opt_00;
  Mat *dst;
  pointer piVar9;
  int iVar10;
  undefined4 extraout_var;
  Allocator *pAVar11;
  undefined4 extraout_var_00;
  ulong uVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  size_t __size;
  uint uVar19;
  int iVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  int *piVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  uint uVar32;
  undefined4 uVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  int size_3;
  Deconvolution *local_188;
  void *local_180;
  Mat local_178;
  Option *local_138;
  ulong local_130;
  ulong local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  Mat *local_110;
  float *local_108;
  long local_100;
  ulong local_f8;
  long local_f0;
  void *local_e8;
  ulong local_e0;
  ulong local_d8;
  void *local_d0;
  void *local_c8;
  ulong local_c0;
  int remain;
  long local_b0;
  long local_a8;
  ulong local_a0;
  Mat *local_98;
  void *local_90;
  long local_88;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_b;
  
  local_d8 = (ulong)(uint)bottom_blob->w;
  local_e0 = (ulong)(uint)bottom_blob->h;
  uVar3 = bottom_blob->c;
  uVar12 = bottom_blob->elemsize;
  iVar24 = (this->kernel_w + -1) * this->dilation_w + (bottom_blob->w - 1U) * this->stride_w + 1;
  iVar10 = (bottom_blob->h - 1U) * this->stride_h;
  uVar19 = (this->kernel_h + -1) * this->dilation_h + iVar10 + 1;
  _size_3 = (ulong)uVar19;
  local_1d8._16_8_ = 0;
  local_1d8._24_4_ = 0;
  local_1d8._0_8_ = (void *)0x0;
  local_1d8._8_4_ = 0;
  local_1d8._12_4_ = 0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  auVar36._0_4_ = -(uint)(0 < this->pad_left);
  auVar36._4_4_ = -(uint)(0 < this->pad_right);
  auVar36._8_4_ = -(uint)(0 < this->pad_top);
  auVar36._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar10 = movmskps(iVar10,auVar36);
  local_188 = this;
  local_138 = opt;
  local_98 = bottom_blob;
  if ((((iVar10 == 0) && (this->output_pad_right < 1)) && (this->output_pad_bottom < 1)) &&
     ((this->output_w < 1 || (this->output_h < 1)))) {
    local_180 = (void *)CONCAT44(local_180._4_4_,iVar24);
    if ((Mat *)local_1d8 == top_blob) {
      piVar27 = (int *)0x0;
      bVar31 = true;
      pAVar11 = (Allocator *)0x0;
      bVar30 = false;
      iVar16 = 0;
      uVar32 = 0;
      iVar10 = 0;
      bVar29 = false;
    }
    else {
      piVar27 = top_blob->refcount;
      if (piVar27 != (int *)0x0) {
        LOCK();
        *piVar27 = *piVar27 + 1;
        UNLOCK();
      }
      local_1d8._0_8_ = top_blob->data;
      piVar27 = top_blob->refcount;
      local_1d8._8_4_ = SUB84(piVar27,0);
      local_1d8._12_4_ = (undefined4)((ulong)piVar27 >> 0x20);
      local_1d8._16_8_ = top_blob->elemsize;
      local_1d8._24_4_ = top_blob->elempack;
      pAVar11 = top_blob->allocator;
      iVar10 = top_blob->w;
      local_1b8._0_8_ = top_blob->allocator;
      local_1b8._8_4_ = top_blob->dims;
      local_1b8._12_4_ = top_blob->w;
      uVar32 = top_blob->h;
      iVar16 = top_blob->c;
      local_1a8._0_4_ = top_blob->h;
      local_1a8._4_4_ = top_blob->c;
      local_1a8._8_8_ = top_blob->cstep;
      bVar29 = top_blob->dims == 3;
      bVar30 = local_1d8._24_4_ == 1;
      bVar31 = (void *)local_1d8._0_8_ == (void *)0x0;
    }
    iVar18 = this->num_output;
    pAVar4 = opt->blob_allocator;
    if (!(bool)(local_1d8._16_8_ == uVar12 & bVar30 &
                (iVar16 == iVar18 && uVar32 == uVar19) & iVar10 == iVar24 & bVar29 &
               pAVar11 == pAVar4)) {
      if (piVar27 != (int *)0x0) {
        LOCK();
        *piVar27 = *piVar27 + -1;
        UNLOCK();
        if (*piVar27 == 0) {
          if ((Allocator *)local_1b8._0_8_ == (Allocator *)0x0) {
            if ((void *)local_1d8._0_8_ != (void *)0x0) {
              free((void *)local_1d8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_1b8._0_8_)[3])();
          }
        }
      }
      local_1d8._0_8_ = (void *)0x0;
      local_1d8._8_4_ = 0;
      local_1d8._12_4_ = 0;
      local_1d8._24_4_ = 1;
      local_1b8._8_4_ = 3;
      local_1b8._0_8_ = pAVar4;
      local_1b8._12_4_ = iVar24;
      local_1a8._4_4_ = iVar18;
      local_1a8._0_4_ = (int)_size_3;
      local_1a8._8_8_ = ((long)((int)_size_3 * iVar24) * uVar12 + 0xf & 0xfffffffffffffff0) / uVar12
      ;
      lVar25 = (long)iVar18 * local_1a8._8_8_;
      if (lVar25 == 0) {
        return -100;
      }
      uVar26 = lVar25 * uVar12 + 3 & 0xfffffffffffffffc;
      __size = uVar26 + 4;
      if (pAVar4 == (Allocator *)0x0) goto LAB_0013b562;
      local_1d8._16_8_ = uVar12;
      iVar10 = (*pAVar4->_vptr_Allocator[2])(pAVar4,__size);
      local_1d8._0_8_ = CONCAT44(extraout_var_00,iVar10);
      goto LAB_0013b57f;
    }
    iVar10 = -100;
    if (bVar31) goto LAB_0013bfad;
  }
  else {
    local_1b8._0_8_ = opt->workspace_allocator;
    local_1d8._0_8_ = (void *)0x0;
    local_1d8._8_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._24_4_ = 1;
    local_1b8._8_4_ = 3;
    local_1b8._12_4_ = iVar24;
    local_1a8._4_4_ = this->num_output;
    local_1a8._0_4_ = uVar19;
    local_1a8._8_8_ = ((long)(int)(uVar19 * iVar24) * uVar12 + 0xf & 0xfffffffffffffff0) / uVar12;
    lVar25 = local_1a8._8_8_ * (long)this->num_output;
    if (lVar25 == 0) {
      return -100;
    }
    uVar26 = lVar25 * uVar12 + 3 & 0xfffffffffffffffc;
    __size = uVar26 + 4;
    if ((Allocator *)local_1b8._0_8_ == (Allocator *)0x0) {
LAB_0013b562:
      local_1d8._24_4_ = 1;
      local_1d8._12_4_ = 0;
      local_1d8._8_4_ = 0;
      local_1d8._0_8_ = (void *)0x0;
      local_178.data = (void *)0x0;
      local_1d8._16_8_ = uVar12;
      iVar10 = posix_memalign(&local_178.data,0x10,__size);
      local_1d8._0_8_ = (void *)0x0;
      if (iVar10 == 0) {
        local_1d8._0_8_ = local_178.data;
      }
    }
    else {
      local_1d8._16_8_ = uVar12;
      iVar10 = (*((Allocator *)local_1b8._0_8_)->_vptr_Allocator[2])(local_1b8._0_8_,__size);
      local_1d8._0_8_ = CONCAT44(extraout_var,iVar10);
    }
LAB_0013b57f:
    piVar27 = (int *)(uVar26 + local_1d8._0_8_);
    *piVar27 = 1;
    local_1d8._8_8_ = piVar27;
  }
  pDVar8 = local_188;
  if ((long)(int)local_1a8._4_4_ * local_1a8._8_8_ == 0) {
    iVar10 = -100;
    goto LAB_0013bfad;
  }
  uVar19 = local_188->kernel_w * local_188->kernel_h;
  local_110 = top_blob;
  std::vector<int,_std::allocator<int>_>::vector
            (&_space_ofs,(long)(int)uVar19,(allocator_type *)&local_178);
  piVar9 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar10 = pDVar8->kernel_h;
  if (0 < iVar10) {
    iVar16 = pDVar8->dilation_h;
    iVar18 = pDVar8->kernel_w;
    iVar14 = pDVar8->dilation_w * iVar18;
    iVar15 = 0;
    iVar17 = 0;
    iVar20 = 0;
    do {
      if (0 < iVar18) {
        lVar25 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar15 + lVar25] = iVar17;
          iVar17 = iVar17 + pDVar8->dilation_w;
          iVar18 = pDVar8->kernel_w;
          lVar25 = lVar25 + 1;
        } while ((int)lVar25 < iVar18);
        iVar15 = iVar15 + (int)lVar25;
        iVar10 = pDVar8->kernel_h;
      }
      iVar17 = iVar17 + (iVar16 * iVar24 - iVar14);
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar10);
  }
  local_b0 = (long)pDVar8->num_output;
  lVar25 = local_b0;
  if (0 < local_b0) {
    local_a0 = local_1d8._16_8_;
    local_100 = local_1a8._8_8_ * local_1d8._16_8_;
    local_120 = local_1b8._12_4_;
    _remain = (ulong)(uint)(local_1a8._0_4_ * local_1b8._12_4_);
    local_118 = local_188->bias_term;
    local_d0 = (local_188->bias_data).data;
    _size_3 = (ulong)(uint)((int)_size_3 * iVar24);
    local_108 = (float *)(local_188->activation_params).data;
    local_c0 = (ulong)(local_1a8._0_4_ * local_1b8._12_4_ + 3 & 0xfffffffc);
    lVar25 = _remain - 1;
    auVar40._8_4_ = (int)lVar25;
    auVar40._0_8_ = lVar25;
    auVar40._12_4_ = (int)((ulong)lVar25 >> 0x20);
    lVar21 = local_1d8._0_8_ + 0xc;
    local_11c = uVar3 * uVar19;
    local_130 = 0;
    auVar40 = auVar40 ^ _DAT_00176060;
    local_f8 = (ulong)(local_188->activation_type - 1);
    local_c8 = (void *)local_1d8._0_8_;
    lVar23 = 0;
    pvVar22 = (void *)local_1d8._0_8_;
    auVar36 = _DAT_00176040;
    auVar41 = _DAT_00176050;
    auVar35 = _DAT_00176060;
    do {
      uVar33 = 0;
      if (local_118 != 0) {
        uVar33 = *(undefined4 *)((long)local_d0 + lVar23 * 4);
      }
      if (0 < remain) {
        uVar12 = 0;
        do {
          auVar37._8_4_ = (int)uVar12;
          auVar37._0_8_ = uVar12;
          auVar37._12_4_ = (int)(uVar12 >> 0x20);
          auVar39 = (auVar37 | auVar41) ^ auVar35;
          iVar10 = auVar40._4_4_;
          if ((bool)(~(iVar10 < auVar39._4_4_ ||
                      auVar40._0_4_ < auVar39._0_4_ && auVar39._4_4_ == iVar10) & 1)) {
            *(undefined4 *)(lVar21 + -0xc + uVar12 * 4) = uVar33;
          }
          if (auVar39._12_4_ <= auVar40._12_4_ &&
              (auVar39._8_4_ <= auVar40._8_4_ || auVar39._12_4_ != auVar40._12_4_)) {
            *(undefined4 *)(lVar21 + -8 + uVar12 * 4) = uVar33;
          }
          auVar37 = (auVar37 | auVar36) ^ auVar35;
          iVar24 = auVar37._4_4_;
          if (iVar24 <= iVar10 && (iVar24 != iVar10 || auVar37._0_4_ <= auVar40._0_4_)) {
            *(undefined4 *)(lVar21 + -4 + uVar12 * 4) = uVar33;
            *(undefined4 *)(lVar21 + uVar12 * 4) = uVar33;
          }
          uVar12 = uVar12 + 4;
        } while (local_c0 != uVar12);
      }
      if (0 < (int)local_e0) {
        local_90 = (void *)(local_100 * lVar23 + (long)local_c8);
        local_114 = local_188->stride_h * local_120;
        local_88 = (long)local_188->stride_w;
        local_180 = (void *)((long)(int)local_130 * 4 + (long)(local_188->weight_data).data);
        local_128 = 0;
        do {
          if (0 < (int)local_d8) {
            iVar10 = local_98->w;
            sVar5 = local_98->elemsize;
            sVar6 = local_98->cstep;
            pvVar7 = local_98->data;
            uVar12 = 0;
            do {
              if (0 < (int)uVar3) {
                lVar25 = uVar12 * local_88 * 4 + (long)(local_114 * (int)local_128) * local_a0;
                uVar26 = 0;
                pvVar13 = local_180;
                do {
                  if (0 < (int)uVar19) {
                    fVar34 = *(float *)((long)pvVar7 +
                                       sVar6 * sVar5 * uVar26 +
                                       uVar12 * 4 + (long)iVar10 * local_128 * sVar5);
                    uVar28 = 0;
                    do {
                      *(float *)((long)local_90 + (long)piVar9[uVar28] * 4 + lVar25) =
                           *(float *)((long)pvVar13 + uVar28 * 4) * fVar34 +
                           *(float *)((long)local_90 + (long)piVar9[uVar28] * 4 + lVar25);
                      uVar28 = uVar28 + 1;
                    } while (uVar19 != uVar28);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar19 * 4);
                } while (uVar26 != uVar3);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != local_d8);
          }
          local_128 = local_128 + 1;
        } while (local_128 != local_e0);
      }
      local_f0 = lVar23;
      local_e8 = pvVar22;
      local_a8 = lVar21;
      if ((uint)local_f8 < 4) {
        iVar10 = (int)_size_3;
        switch((long)&switchD_0013b9fa::switchdataD_00177c30 +
               (long)(int)(&switchD_0013b9fa::switchdataD_00177c30)[local_f8]) {
        case 0x13b9fc:
          if (0 < iVar10) {
            uVar12 = 0;
            do {
              fVar34 = *(float *)((long)pvVar22 + uVar12 * 4);
              if (fVar34 <= 0.0) {
                fVar34 = 0.0;
              }
              *(float *)((long)pvVar22 + uVar12 * 4) = fVar34;
              uVar12 = uVar12 + 1;
            } while (_size_3 != uVar12);
          }
          break;
        case 0x13ba25:
          if (0 < iVar10) {
            fVar34 = *local_108;
            fVar1 = local_108[1];
            uVar12 = 0;
            do {
              fVar2 = *(float *)((long)pvVar22 + uVar12 * 4);
              fVar38 = fVar2;
              if (fVar2 <= fVar34) {
                fVar38 = fVar34;
              }
              if ((fVar2 < fVar34) || (fVar1 < fVar38)) {
                if (fVar1 <= fVar38) {
                  fVar38 = fVar1;
                }
                *(float *)((long)pvVar22 + uVar12 * 4) = fVar38;
              }
              uVar12 = uVar12 + 1;
            } while (_size_3 != uVar12);
          }
          break;
        case 0x13ba69:
          if (0 < iVar10) {
            uVar12 = 0;
            do {
              fVar34 = expf((float)(*(uint *)((long)local_e8 + uVar12 * 4) ^ auVar35._0_4_));
              auVar35 = _DAT_00176060;
              auVar41 = _DAT_00176050;
              auVar36 = _DAT_00176040;
              *(float *)((long)local_e8 + uVar12 * 4) = 1.0 / (fVar34 + 1.0);
              uVar12 = uVar12 + 1;
            } while (_size_3 != uVar12);
          }
          break;
        case 0x13bad8:
          if (0 < iVar10) {
            fVar34 = *local_108;
            uVar12 = 0;
            do {
              fVar1 = *(float *)((long)pvVar22 + uVar12 * 4);
              uVar32 = -(uint)(0.0 < fVar1);
              *(float *)((long)pvVar22 + uVar12 * 4) =
                   (float)(~uVar32 & (uint)fVar34 | uVar32 & 0x3f800000) * fVar1;
              uVar12 = uVar12 + 1;
            } while (_size_3 != uVar12);
          }
        }
      }
      lVar23 = local_f0 + 1;
      lVar21 = local_a8 + local_100;
      local_130 = (ulong)(uint)((int)local_130 + local_11c);
      pvVar22 = (void *)((long)local_e8 + local_100);
      lVar25 = local_100;
    } while (lVar23 != local_b0);
  }
  dst = local_110;
  opt_00 = local_138;
  pDVar8 = local_188;
  auVar41 = local_1a8;
  auVar36 = local_1b8;
  auVar35._0_4_ = -(uint)(0 < local_188->pad_left);
  auVar35._4_4_ = -(uint)(0 < local_188->pad_right);
  auVar35._8_4_ = -(uint)(0 < local_188->pad_top);
  auVar35._12_4_ = -(uint)(0 < local_188->pad_bottom);
  iVar10 = movmskps((int)lVar25,auVar35);
  if (iVar10 == 0) {
    if ((local_188->output_w < 1) || (local_188->output_h < 1)) {
      if (local_188->output_pad_bottom < 1 && local_188->output_pad_right < 1) {
        Mat::operator=(local_110,(Mat *)local_1d8);
      }
      else {
        copy_make_border((Mat *)local_1d8,local_110,0,local_188->output_pad_bottom,0,
                         local_188->output_pad_right,0,0.0,local_138);
        iVar10 = -100;
        if ((dst->data == (void *)0x0) || ((long)dst->c * dst->cstep == 0)) goto LAB_0013bf8b;
      }
LAB_0013bf76:
      iVar10 = 0;
    }
    else {
      local_178.data = (void *)local_1d8._0_8_;
      local_178.elemsize = local_1d8._16_8_;
      local_178.elempack = local_1d8._24_4_;
      local_178.allocator = (Allocator *)local_1b8._0_8_;
      local_178.dims = local_1b8._8_4_;
      local_178.w = local_1b8._12_4_;
      local_178.h = local_1a8._0_4_;
      local_178.c = local_1a8._4_4_;
      local_178.cstep = local_1a8._8_8_;
      if ((int *)local_1d8._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + 1;
        UNLOCK();
      }
      local_1b8 = auVar36;
      local_1a8 = auVar41;
      local_178.refcount = (int *)local_1d8._8_8_;
      if (local_188->output_pad_bottom < 1 && local_188->output_pad_right < 1) {
LAB_0013be19:
        iVar24 = local_178.w - pDVar8->output_w;
        iVar10 = local_178.h - pDVar8->output_h;
        if ((pDVar8->pad_left == -0xe9) ||
           (((pDVar8->pad_right == -0xe9 || (pDVar8->pad_top == -0xe9)) ||
            (pDVar8->pad_bottom == -0xe9)))) {
          iVar18 = iVar10 / 2;
          iVar16 = iVar10 - iVar18;
          iVar14 = iVar24 / 2;
          iVar10 = iVar24 - iVar14;
LAB_0013be90:
          copy_cut_border(&local_178,dst,iVar18,iVar16,iVar14,iVar10,opt_00);
        }
        else if ((pDVar8->pad_top == -0xea ||
                 (pDVar8->pad_right == -0xea || pDVar8->pad_left == -0xea)) ||
                 pDVar8->pad_bottom == -0xea) {
          iVar16 = iVar10 / 2;
          iVar18 = iVar10 - iVar16;
          iVar10 = iVar24 / 2;
          iVar14 = iVar24 - iVar10;
          goto LAB_0013be90;
        }
        if (dst->data != (void *)0x0) {
          iVar10 = dst->c;
          sVar5 = dst->cstep;
          Mat::~Mat(&local_178);
          if ((long)iVar10 * sVar5 == 0) goto LAB_0013bf86;
          goto LAB_0013bf76;
        }
      }
      else {
        opt_b.use_int8_arithmetic = local_138->use_int8_arithmetic;
        opt_b.use_packing_layout = local_138->use_packing_layout;
        opt_b._34_6_ = *(undefined6 *)&local_138->field_0x22;
        opt_b.lightmode = local_138->lightmode;
        opt_b._1_3_ = *(undefined3 *)&local_138->field_0x1;
        opt_b.num_threads = local_138->num_threads;
        opt_b.workspace_allocator = local_138->workspace_allocator;
        opt_b.use_winograd_convolution = local_138->use_winograd_convolution;
        opt_b.use_sgemm_convolution = local_138->use_sgemm_convolution;
        opt_b.use_int8_inference = local_138->use_int8_inference;
        opt_b.use_vulkan_compute = local_138->use_vulkan_compute;
        opt_b.use_fp16_packed = local_138->use_fp16_packed;
        opt_b.use_fp16_storage = local_138->use_fp16_storage;
        opt_b.use_fp16_arithmetic = local_138->use_fp16_arithmetic;
        opt_b.use_int8_storage = local_138->use_int8_storage;
        opt_b.blob_allocator = local_138->workspace_allocator;
        copy_make_border((Mat *)local_1d8,&local_178,0,local_188->output_pad_bottom,0,
                         local_188->output_pad_right,0,0.0,&opt_b);
        if ((local_178.data != (void *)0x0) && ((long)local_178.c * local_178.cstep != 0))
        goto LAB_0013be19;
      }
      Mat::~Mat(&local_178);
LAB_0013bf86:
      iVar10 = -100;
    }
  }
  else {
    local_178.data = (void *)local_1d8._0_8_;
    local_178.elemsize = local_1d8._16_8_;
    local_178.elempack = local_1d8._24_4_;
    local_178.allocator = (Allocator *)local_1b8._0_8_;
    local_178.dims = local_1b8._8_4_;
    local_178.w = local_1b8._12_4_;
    local_178.h = local_1a8._0_4_;
    local_178.c = local_1a8._4_4_;
    local_178.cstep = local_1a8._8_8_;
    if ((int *)local_1d8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1d8._8_8_ = *(int *)local_1d8._8_8_ + 1;
      UNLOCK();
    }
    local_1b8 = auVar36;
    local_1a8 = auVar41;
    local_178.refcount = (int *)local_1d8._8_8_;
    if (0 < local_188->output_pad_bottom || 0 < local_188->output_pad_right) {
      opt_b.use_int8_arithmetic = local_138->use_int8_arithmetic;
      opt_b.use_packing_layout = local_138->use_packing_layout;
      opt_b._34_6_ = *(undefined6 *)&local_138->field_0x22;
      opt_b.lightmode = local_138->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_138->field_0x1;
      opt_b.num_threads = local_138->num_threads;
      opt_b.workspace_allocator = local_138->workspace_allocator;
      opt_b.use_winograd_convolution = local_138->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_138->use_sgemm_convolution;
      opt_b.use_int8_inference = local_138->use_int8_inference;
      opt_b.use_vulkan_compute = local_138->use_vulkan_compute;
      opt_b.use_fp16_packed = local_138->use_fp16_packed;
      opt_b.use_fp16_storage = local_138->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_138->use_fp16_arithmetic;
      opt_b.use_int8_storage = local_138->use_int8_storage;
      opt_b.blob_allocator = local_138->workspace_allocator;
      copy_make_border((Mat *)local_1d8,&local_178,0,local_188->output_pad_bottom,0,
                       local_188->output_pad_right,0,0.0,&opt_b);
      if ((local_178.data == (void *)0x0) || ((long)local_178.c * local_178.cstep == 0)) {
        if (local_178.refcount != (int *)0x0) {
          LOCK();
          *local_178.refcount = *local_178.refcount + -1;
          UNLOCK();
          if (*local_178.refcount == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if (local_178.data != (void *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_0013bf86;
      }
    }
    copy_cut_border(&local_178,dst,pDVar8->pad_top,pDVar8->pad_bottom,pDVar8->pad_left,
                    pDVar8->pad_right,opt_00);
    if ((dst->data == (void *)0x0) || (bVar31 = true, (long)dst->c * dst->cstep == 0)) {
      bVar31 = false;
    }
    if (local_178.refcount != (int *)0x0) {
      LOCK();
      *local_178.refcount = *local_178.refcount + -1;
      UNLOCK();
      if (*local_178.refcount == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar10 = -100;
    if (bVar31) goto LAB_0013bf76;
  }
LAB_0013bf8b:
  piVar27 = (int *)local_1d8._8_8_;
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    piVar27 = (int *)local_1d8._8_8_;
  }
LAB_0013bfad:
  if (piVar27 != (int *)0x0) {
    LOCK();
    *piVar27 = *piVar27 + -1;
    UNLOCK();
    if (*piVar27 == 0) {
      if ((Allocator *)local_1b8._0_8_ == (Allocator *)0x0) {
        if ((void *)local_1d8._0_8_ != (void *)0x0) {
          free((void *)local_1d8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1b8._0_8_)[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = 1.f / (1.f + exp(-outptr[i]));
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}